

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

int cram_flush_container2(cram_fd *fd,cram_container *c)

{
  cram_slice *pcVar1;
  int iVar2;
  cram_slice *s;
  int j;
  int i;
  cram_container *c_local;
  cram_fd *fd_local;
  
  iVar2 = cram_write_container(fd,c);
  if (iVar2 == 0) {
    iVar2 = cram_write_block(fd,c->comp_hdr_block);
    if (iVar2 == 0) {
      for (s._4_4_ = 0; s._4_4_ < c->curr_slice; s._4_4_ = s._4_4_ + 1) {
        pcVar1 = c->slices[s._4_4_];
        iVar2 = cram_write_block(fd,pcVar1->hdr_block);
        if (iVar2 != 0) {
          return -1;
        }
        for (s._0_4_ = 0; (int)s < pcVar1->hdr->num_blocks; s._0_4_ = (int)s + 1) {
          iVar2 = cram_write_block(fd,pcVar1->block[(int)s]);
          if (iVar2 != 0) {
            return -1;
          }
        }
      }
      iVar2 = hflush(fd->fp);
      fd_local._4_4_ = -1;
      if (iVar2 == 0) {
        fd_local._4_4_ = 0;
      }
    }
    else {
      fd_local._4_4_ = -1;
    }
  }
  else {
    fd_local._4_4_ = -1;
  }
  return fd_local._4_4_;
}

Assistant:

static int cram_flush_container2(cram_fd *fd, cram_container *c) {
    int i, j;

    //fprintf(stderr, "Writing container %d, sum %u\n", c->record_counter, sum);

    /* Write the container struct itself */
    if (0 != cram_write_container(fd, c))
	return -1;

    /* And the compression header */
    if (0 != cram_write_block(fd, c->comp_hdr_block))
	return -1;

    /* Followed by the slice blocks */
    for (i = 0; i < c->curr_slice; i++) {
	cram_slice *s = c->slices[i];

	if (0 != cram_write_block(fd, s->hdr_block))
	    return -1;

	for (j = 0; j < s->hdr->num_blocks; j++) {
	    if (0 != cram_write_block(fd, s->block[j]))
		return -1;
	}
    }

    return hflush(fd->fp) == 0 ? 0 : -1;
}